

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::save_load_node
               (node *cn,io_buf *model_file,bool *read,bool *text,stringstream *msg)

{
  stringstream *this;
  bool bVar1;
  ostream *poVar2;
  v_array<unsigned_int> *this_00;
  uint uVar3;
  ulong uVar4;
  size_t leaf_n_examples;
  ulong local_50;
  uint local_44;
  bool *local_40;
  stringstream *local_38;
  
  this = msg + 0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"parent",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)cn,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)cn,4,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"internal",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = (ostream *)std::ostream::operator<<(this,cn->internal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->internal,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->internal,4,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"depth",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->depth,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->depth,4,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"base_router",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->base_router,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->base_router,4,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"left",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->left,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->left,4,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"right",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->right,4,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->right,4,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"nl",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<double>(cn->nl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->nl,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->nl,8,msg,*text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"nr",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<double>(cn->nr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&cn->nr,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&cn->nr,8,msg,*text);
  }
  local_50 = (long)(cn->examples_index)._end - (long)(cn->examples_index)._begin >> 2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"leaf_n_examples",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (*read == true) {
    io_buf::bin_read_fixed(model_file,(char *)&local_50,8,"");
  }
  else {
    bin_text_write_fixed(model_file,(char *)&local_50,8,msg,*text);
  }
  this_00 = &cn->examples_index;
  local_40 = text;
  local_38 = msg;
  if (*read != false) {
    v_array<unsigned_int>::clear(this_00);
    if (local_50 == 0) {
      return;
    }
    uVar4 = 1;
    do {
      local_44 = 0;
      v_array<unsigned_int>::push_back(this_00,&local_44);
      bVar1 = uVar4 < local_50;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  if (local_50 != 0) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"example_location",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," = ",3);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (*read == true) {
        io_buf::bin_read_fixed(model_file,(char *)(this_00->_begin + uVar4),4,"");
      }
      else {
        bin_text_write_fixed(model_file,(char *)(this_00->_begin + uVar4),4,local_38,*local_40);
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < local_50);
  }
  return;
}

Assistant:

void save_load_node(node& cn, io_buf& model_file, bool& read, bool& text, stringstream& msg)
    {
        writeit(cn.parent, "parent");
        writeit(cn.internal, "internal");
        writeit(cn.depth, "depth");
        writeit(cn.base_router, "base_router");
        writeit(cn.left, "left");
        writeit(cn.right, "right");
        writeit(cn.nl, "nl");
        writeit(cn.nr, "nr");
        writeitvar(cn.examples_index.size(), "leaf_n_examples", leaf_n_examples);
        if (read){
            cn.examples_index.clear();
            for (uint32_t k = 0; k < leaf_n_examples; k++)
                    cn.examples_index.push_back(0);
        }
        for (uint32_t k = 0; k < leaf_n_examples; k++)
            writeit(cn.examples_index[k], "example_location");
    }